

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk_info.cpp
# Opt level: O3

idx_t __thiscall
duckdb::ChunkVectorInfo::TemplatedGetSelVector<duckdb::TransactionVersionOperator>
          (ChunkVectorInfo *this,transaction_t start_time,transaction_t transaction_id,
          SelectionVector *sel_vector,idx_t max_count)

{
  ulong uVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t i;
  idx_t iVar4;
  
  if (this->same_inserted_id == true) {
    uVar1 = this->insert_id;
    if (this->any_deleted == false) {
      iVar3 = 0;
      if (uVar1 == transaction_id || start_time > uVar1) {
        iVar3 = max_count;
      }
      return iVar3;
    }
    if (uVar1 != transaction_id && start_time <= uVar1 || max_count == 0) {
      return 0;
    }
    psVar2 = sel_vector->sel_vector;
    iVar4 = 0;
    iVar3 = 0;
    do {
      if (this->deleted[iVar4] != transaction_id && start_time <= this->deleted[iVar4]) {
        psVar2[iVar3] = (sel_t)iVar4;
        iVar3 = iVar3 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (max_count != iVar4);
  }
  else if (this->any_deleted == false) {
    if (max_count == 0) {
      return 0;
    }
    psVar2 = sel_vector->sel_vector;
    iVar4 = 0;
    iVar3 = 0;
    do {
      if (this->inserted[iVar4] < start_time || this->inserted[iVar4] == transaction_id) {
        psVar2[iVar3] = (sel_t)iVar4;
        iVar3 = iVar3 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (max_count != iVar4);
  }
  else {
    if (max_count == 0) {
      return 0;
    }
    psVar2 = sel_vector->sel_vector;
    iVar4 = 0;
    iVar3 = 0;
    do {
      if ((this->inserted[iVar4] < start_time || this->inserted[iVar4] == transaction_id) &&
         (this->deleted[iVar4] != transaction_id && start_time <= this->deleted[iVar4])) {
        psVar2[iVar3] = (sel_t)iVar4;
        iVar3 = iVar3 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (max_count != iVar4);
  }
  return iVar3;
}

Assistant:

idx_t ChunkVectorInfo::TemplatedGetSelVector(transaction_t start_time, transaction_t transaction_id,
                                             SelectionVector &sel_vector, idx_t max_count) const {
	idx_t count = 0;
	if (same_inserted_id && !any_deleted) {
		// all tuples have the same inserted id: and no tuples were deleted
		if (OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return max_count;
		} else {
			return 0;
		}
	} else if (same_inserted_id) {
		if (!OP::UseInsertedVersion(start_time, transaction_id, insert_id)) {
			return 0;
		}
		// have to check deleted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else if (!any_deleted) {
		// have to check inserted flag
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	} else {
		// have to check both flags
		for (idx_t i = 0; i < max_count; i++) {
			if (OP::UseInsertedVersion(start_time, transaction_id, inserted[i]) &&
			    OP::UseDeletedVersion(start_time, transaction_id, deleted[i])) {
				sel_vector.set_index(count++, i);
			}
		}
	}
	return count;
}